

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

void phyr::latinHypercube(double *sample,int nSamples,int nDimensions,RNG *rng)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  uVar8 = (ulong)(uint)nDimensions;
  if (0 < nSamples) {
    uVar4 = *(ulong *)rng;
    lVar1 = *(long *)(rng + 8);
    uVar11 = 0;
    pdVar9 = sample;
    do {
      if (0 < nDimensions) {
        uVar10 = 0;
        do {
          uVar6 = (uint)(uVar4 >> 0x2d) ^ (uint)(uVar4 >> 0x1b);
          bVar5 = (byte)(uVar4 >> 0x3b);
          uVar4 = uVar4 * 0x5851f42d4c957f2d + lVar1;
          dVar12 = (double)((float)(uVar6 >> bVar5 | uVar6 << 0x20 - bVar5) * 2.3283064e-10);
          if (0.9999999999999999 <= dVar12) {
            dVar12 = 0.9999999999999999;
          }
          dVar13 = (dVar12 + (double)(int)uVar11) * (1.0 / (double)nSamples);
          dVar12 = 0.9999999999999999;
          if (dVar13 <= 0.9999999999999999) {
            dVar12 = dVar13;
          }
          pdVar9[uVar10] = dVar12;
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        *(ulong *)rng = uVar4;
      }
      uVar11 = uVar11 + 1;
      pdVar9 = pdVar9 + uVar8;
    } while (uVar11 != (uint)nSamples);
  }
  if (0 < nDimensions) {
    uVar4 = *(ulong *)rng;
    lVar1 = *(long *)(rng + 8);
    uVar11 = 0;
    do {
      if (0 < nSamples) {
        uVar10 = 0;
        do {
          uVar6 = nSamples - (int)uVar10;
          uVar7 = uVar4;
          do {
            uVar4 = uVar7 * 0x5851f42d4c957f2d + lVar1;
            uVar2 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
            bVar5 = (byte)(uVar7 >> 0x3b);
            uVar2 = uVar2 >> bVar5 | uVar2 << 0x20 - bVar5;
            uVar7 = uVar4;
          } while (uVar2 < -uVar6 % uVar6);
          iVar3 = (uVar2 % uVar6 + (int)uVar10) * nDimensions + (int)uVar11;
          dVar12 = sample[uVar11 + uVar10 * uVar8];
          sample[uVar11 + uVar10 * uVar8] = sample[iVar3];
          sample[iVar3] = dVar12;
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)nSamples);
        *(ulong *)rng = uVar4;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar8);
  }
  return;
}

Assistant:

void latinHypercube(Real* sample, int nSamples, int nDimensions, RNG& rng) {
    // Generate LHS samples along the diagonal
    Real invSamples = Real(1) / nSamples;
    for (int i = 0; i < nSamples; i++) {
        for (int j = 0; j < nDimensions; j++) {
            Real offset = (i + rng.uniformReal()) * invSamples;
            sample[nDimensions * i + j] = std::min(offset, OneMinusEpsilon);
        }
    }

    // Permute LHS samples in each dimension
    for (int i = 0; i < nDimensions; i++) {
        for (int j = 0; j < nSamples; j++) {
            int swapIdx = j + rng.uniformUInt32(nSamples - j);
            std::swap(sample[nDimensions * j + i], sample[nDimensions * swapIdx + i]);
        }
    }
}